

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

bool __thiscall tinyusdz::ascii::AsciiParser::ParseCustomMetaValue(AsciiParser *this)

{
  ostream *poVar1;
  ostringstream ss_e;
  string local_1a8;
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  ::std::__cxx11::ostringstream::ostringstream(local_188);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"[error]",7);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,
             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
             ,0x56);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,":",1);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"ParseCustomMetaValue",0x14);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"():",3);
  poVar1 = (ostream *)::std::ostream::operator<<(local_188,0x93c);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"TODO",4);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"\n",1);
  ::std::__cxx11::stringbuf::str();
  PushError(this,&local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_188);
  ::std::ios_base::~ios_base(local_118);
  return false;
}

Assistant:

bool AsciiParser::ParseCustomMetaValue() {
  // type identifier '=' value

  // return ParseAttributeMeta();
  PUSH_ERROR_AND_RETURN("TODO");
}